

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O0

void address_space_stb_m68k
               (uc_struct_conflict3 *uc,AddressSpace *as,hwaddr addr,uint32_t val,MemTxAttrs attrs,
               MemTxResult *result)

{
  _Bool _Var1;
  MemTxResult local_5c;
  _Bool release_lock;
  ram_addr_t rStack_58;
  MemTxResult r;
  hwaddr addr1;
  hwaddr l;
  MemoryRegion *mr;
  uint8_t *ptr;
  MemTxResult *result_local;
  hwaddr hStack_28;
  uint32_t val_local;
  hwaddr addr_local;
  AddressSpace *as_local;
  uc_struct_conflict3 *uc_local;
  MemTxAttrs attrs_local;
  
  addr1 = 1;
  ptr = (uint8_t *)result;
  result_local._4_4_ = val;
  hStack_28 = addr;
  addr_local = (hwaddr)as;
  as_local = (AddressSpace *)uc;
  uc_local._4_4_ = attrs;
  l = (hwaddr)address_space_translate(as,addr,&stack0xffffffffffffffa8,&addr1,true,attrs);
  _Var1 = memory_access_is_direct((MemoryRegion *)l,true);
  if (_Var1) {
    mr = (MemoryRegion *)
         qemu_map_ram_ptr_m68k(*(uc_struct_conflict3 **)(l + 0x80),*(RAMBlock **)(l + 8),rStack_58);
    stb_p(mr,(uint8_t)result_local._4_4_);
    invalidate_and_set_dirty((MemoryRegion *)l,rStack_58,1);
    local_5c = 0;
  }
  else {
    prepare_mmio_access((MemoryRegion *)l);
    local_5c = memory_region_dispatch_write_m68k
                         ((uc_struct_conflict3 *)as_local,(MemoryRegion *)l,rStack_58,
                          (ulong)result_local._4_4_,MO_8,uc_local._4_4_);
  }
  if (ptr != (uint8_t *)0x0) {
    *(MemTxResult *)ptr = local_5c;
  }
  return;
}

Assistant:

void glue(address_space_stb, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, uint32_t val, MemTxAttrs attrs, MemTxResult *result)
{
    uint8_t *ptr;
    MemoryRegion *mr;
    hwaddr l = 1;
    hwaddr addr1;
    MemTxResult r;
    bool release_lock = false;

    //RCU_READ_LOCK();
    mr = TRANSLATE(addr, &addr1, &l, true, attrs);
    if (!memory_access_is_direct(mr, true)) {
        release_lock |= prepare_mmio_access(mr);
        r = memory_region_dispatch_write(uc, mr, addr1, val, MO_8, attrs);
    } else {
        /* RAM case */
        ptr = qemu_map_ram_ptr(mr->uc, mr->ram_block, addr1);
        stb_p(ptr, val);
        invalidate_and_set_dirty(mr, addr1, 1);
        r = MEMTX_OK;
    }
    if (result) {
        *result = r;
    }
    //RCU_READ_UNLOCK();
}